

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2v.h
# Opt level: O2

void m2v_toggle_el(m2v *M,int r,int c)

{
  M->e[c / 0x20 + r * M->row_stride] = M->e[c / 0x20 + r * M->row_stride] ^ 1 << ((byte)c & 0x1f);
  return;
}

Assistant:

inline void m2v_toggle_el(m2v* M, int r, int c)
{
	assert(0 <= r && r < M->n_row);
	assert(0 <= c && c < M->n_col);
	const int w = m2v__get_word(M, r, c);
	const int b = m2v__get_bit(M, c);
	const m2v_base m = m2v__get_mask(b);
	M->e[w] ^= m;
}